

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

ByteData * cfd::core::CreatePsbtOutputOnlyData(ByteData *__return_storage_ptr__,wally_psbt *psbt)

{
  uchar *puVar1;
  size_type sVar2;
  void *__src;
  undefined8 *puVar3;
  ulong local_b8;
  size_t i_1;
  wally_map_item *item;
  size_t i;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_98 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  undefined1 local_68 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> tx;
  undefined1 local_40 [8];
  Serializer builder;
  wally_psbt *psbt_local;
  
  builder._32_8_ = psbt;
  Serializer::Serializer((Serializer *)local_40);
  Serializer::AddDirectBytes((Serializer *)local_40,(uint8_t *)builder._32_8_,5);
  Serializer::AddDirectByte((Serializer *)local_40,'\x01');
  Serializer::AddVariableInt((Serializer *)local_40,0);
  ConvertBitcoinTxFromWally
            ((ByteData *)
             &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,*(wally_tx **)(builder._32_8_ + 8),false);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,
                     (ByteData *)
                     &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage);
  ByteData::~ByteData((ByteData *)
                      &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  puVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68);
  sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68);
  Serializer::AddVariableBuffer((Serializer *)local_40,puVar1,(uint32_t)sVar2);
  if (*(int *)(builder._32_8_ + 0x58) != 0) {
    Serializer::AddDirectByte((Serializer *)local_40,'\x01');
    Serializer::AddVariableInt((Serializer *)local_40,0xfb);
    ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&i + 7));
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (local_98,4,(allocator<unsigned_char> *)((long)&i + 7));
    ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&i + 7));
    puVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_98);
    __src = (void *)(builder._32_8_ + 0x58);
    sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_98);
    memcpy(puVar1,__src,sVar2);
    puVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_98);
    Serializer::AddVariableBuffer((Serializer *)local_40,puVar1,4);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(local_98);
  }
  for (item = (wally_map_item *)0x0; item < *(wally_map_item **)(builder._32_8_ + 0x48);
      item = (wally_map_item *)((long)&item->key + 1)) {
    puVar3 = (undefined8 *)(*(long *)(builder._32_8_ + 0x40) + (long)item * 0x20);
    Serializer::AddVariableBuffer
              ((Serializer *)local_40,(uint8_t *)*puVar3,*(uint32_t *)(puVar3 + 1));
    Serializer::AddVariableBuffer
              ((Serializer *)local_40,(uint8_t *)puVar3[2],*(uint32_t *)(puVar3 + 3));
  }
  Serializer::AddDirectByte((Serializer *)local_40,'\0');
  for (local_b8 = 0; local_b8 < *(ulong *)(builder._32_8_ + 0x30); local_b8 = local_b8 + 1) {
    WritePsbtOutput((Serializer *)local_40,
                    (wally_psbt_output *)(*(long *)(builder._32_8_ + 0x28) + local_b8 * 0xd0));
  }
  Serializer::Output(__return_storage_ptr__,(Serializer *)local_40);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68);
  Serializer::~Serializer((Serializer *)local_40);
  return __return_storage_ptr__;
}

Assistant:

ByteData CreatePsbtOutputOnlyData(const struct wally_psbt *psbt) {
  Serializer builder;
  builder.AddDirectBytes(psbt->magic, sizeof(psbt->magic));

  builder.AddDirectByte(1);
  builder.AddVariableInt(Psbt::kPsbtGlobalUnsignedTx);
  auto tx = ConvertBitcoinTxFromWally(psbt->tx, false).GetBytes();
  builder.AddVariableBuffer(tx.data(), static_cast<uint32_t>(tx.size()));

  if (psbt->version > 0) {
    builder.AddDirectByte(1);
    builder.AddVariableInt(Psbt::kPsbtGlobalVersion);
    std::vector<uint8_t> data(sizeof(psbt->version));
    memcpy(data.data(), &psbt->version, data.size());
    // TODO(k-matsuzawa) need endian support.
    builder.AddVariableBuffer(data.data(), sizeof(psbt->version));
  }

  for (size_t i = 0; i < psbt->unknowns.num_items; ++i) {
    auto *item = &psbt->unknowns.items[i];
    builder.AddVariableBuffer(item->key, static_cast<uint32_t>(item->key_len));
    builder.AddVariableBuffer(
        item->value, static_cast<uint32_t>(item->value_len));
  }
  builder.AddDirectByte(kPsbtSeparator);

  // input is unsupport.

  for (size_t i = 0; i < psbt->num_outputs; ++i) {
    WritePsbtOutput(&builder, &psbt->outputs[i]);
  }
  return builder.Output();
}